

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tfidfinit.cpp
# Opt level: O0

bool __thiscall point::operator<(point *this,point *ff)

{
  int iVar1;
  const_reference pvVar2;
  int local_24;
  int i;
  point *ff_local;
  point *this_local;
  
  local_24 = 0;
  while( true ) {
    if (this->d <= local_24) {
      return false;
    }
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&this->f,(long)local_24);
    iVar1 = *pvVar2;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&ff->f,(long)local_24);
    if (iVar1 != *pvVar2) break;
    local_24 = local_24 + 1;
  }
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&this->f,(long)local_24);
  iVar1 = *pvVar2;
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&ff->f,(long)local_24);
  return iVar1 < *pvVar2;
}

Assistant:

bool operator<(const point ff) const {
        for (int i = 0; i < d; ++i) {
            if (f[i] != ff.f[i]) {
                return f[i] < ff.f[i];
            }
        }
        return false;
    }